

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CadicalInterfacing.cpp
# Opt level: O3

VarAssignment __thiscall SAT::CadicalInterfacing::getAssignment(CadicalInterfacing *this,uint var)

{
  int iVar1;
  VarAssignment VVar2;
  
  iVar1 = CaDiCaL::Solver::vars(&this->_solver);
  VVar2 = DONT_CARE;
  if ((int)var <= iVar1) {
    iVar1 = CaDiCaL::Solver::val(&this->_solver,var);
    VVar2 = (VarAssignment)(iVar1 < 1);
  }
  return VVar2;
}

Assistant:

SATSolver::VarAssignment CadicalInterfacing::getAssignment(unsigned var)
{
  ASS_EQ(_status, Status::SATISFIABLE);
  ASS_G(var,0); ASS_L((int)var,_next);

  if((int)var > _solver.vars())
    return VarAssignment::DONT_CARE;
  int phase = _solver.val(var);
  return phase > 0 ? VarAssignment::TRUE : VarAssignment::FALSE;
}